

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pretty_printer.hpp
# Opt level: O2

void __thiscall trial::protocol::json::example::pretty_printer::print(pretty_printer *this)

{
  value vVar1;
  error *this_00;
  error_category *peVar2;
  error_code ec;
  error_code ec_00;
  
  vVar1 = symbol(this);
  switch(vVar1) {
  case begin_array:
    print_array(this,false);
    break;
  case end_array:
    this_00 = (error *)__cxa_allocate_exception(0x20);
    peVar2 = error_category();
    ec_00._M_cat = peVar2;
    ec_00._0_8_ = 5;
    error::error(this_00,ec_00);
    goto LAB_001028b5;
  case begin_object:
    print_object(this,false);
    break;
  case end_object:
    this_00 = (error *)__cxa_allocate_exception(0x20);
    peVar2 = error_category();
    ec._M_cat = peVar2;
    ec._0_8_ = 6;
    error::error(this_00,ec);
LAB_001028b5:
    __cxa_throw(this_00,&error::typeinfo,std::system_error::~system_error);
  default:
    print_value(this);
  }
  newline(this);
  return;
}

Assistant:

void print()
    {
        // Print outer scope
        switch (symbol())
        {
        case json::token::symbol::begin_array:
            print_array(false);
            break;

        case json::token::symbol::end_array:
            throw json::error(make_error_code(json::unbalanced_end_array));

        case json::token::symbol::begin_object:
            print_object(false);
            break;

        case json::token::symbol::end_object:
            throw json::error(make_error_code(json::unbalanced_end_object));

        default:
            print_value();
            break;
        }
        newline();
    }